

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
poplar::
compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::get_parent_and_symb
          (compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,uint64_t node_id)

{
  bool bVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  
  uVar4 = 0;
  bVar1 = compare_dsp_(this,node_id,0);
  uVar2 = 0xffffffffffffffff;
  if (!bVar1) {
    uVar3 = get_dsp_(this,node_id);
    uVar2 = (node_id - uVar3) + 1 + (this->table_).size_;
    if (uVar3 - 1 <= node_id) {
      uVar2 = node_id - (uVar3 - 1);
    }
    uVar3 = get_quo_(this,node_id);
    uVar3 = bijective_hash::split_mix_hasher::hash_inv
                      (&this->hasher_,
                       uVar3 << ((ulong)(byte)(this->capa_size_).bits_ & 0x3f) | uVar2);
    uVar2 = uVar3 >> ((ulong)(byte)(this->symb_size_).bits_ & 0x3f);
    uVar4 = uVar3 & (this->symb_size_).mask_;
  }
  pVar5.second = uVar4;
  pVar5.first = uVar2;
  return pVar5;
}

Assistant:

std::pair<uint64_t, uint64_t> get_parent_and_symb(uint64_t node_id) const {
        assert(node_id < capa_size_.size());

        if (compare_dsp_(node_id, 0)) {
            // root or not exist
            return {nil_id, 0};
        }

        uint64_t dist = get_dsp_(node_id) - 1;
        uint64_t init_id = dist <= node_id ? node_id - dist : table_.size() - (dist - node_id);
        uint64_t key = hasher_.hash_inv(get_quo_(node_id) << capa_size_.bits() | init_id);

        // Returns pair (parent, label)
        return std::make_pair(key >> symb_size_.bits(), key & symb_size_.mask());
    }